

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

_variable_type
gl4cts::ShaderSubroutine::Utils::getVariableTypeFromProperties
          (_variable_type *base_variable_type,uint *n_components)

{
  TestError *this;
  
  switch(*base_variable_type) {
  case VARIABLE_TYPE_BOOL:
    if (*n_components - VARIABLE_TYPE_BVEC2 < VARIABLE_TYPE_DOUBLE) {
      return *n_components - VARIABLE_TYPE_BVEC2;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unsupported number of components requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x5a1);
    break;
  case VARIABLE_TYPE_DOUBLE:
    if (*n_components - 1 < 4) {
      return *n_components + VARIABLE_TYPE_BVEC4;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unsupported number of components requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x5bb);
    break;
  case VARIABLE_TYPE_FLOAT:
    if (*n_components - 1 < 4) {
      return *(_variable_type *)(&DAT_016affc0 + (ulong)(*n_components - 1) * 4);
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unsupported number of components requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x5d5);
    break;
  case VARIABLE_TYPE_INT:
    if (*n_components - VARIABLE_TYPE_BVEC2 < 4) {
      return *n_components | VARIABLE_TYPE_FLOAT;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unsupported number of components requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x5ef);
    break;
  default:
    if (*base_variable_type == VARIABLE_TYPE_UINT) {
      if (*n_components - 1 < 4) {
        return *n_components + VARIABLE_TYPE_MAT4X3;
      }
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unsupported number of components requested",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x609);
      break;
    }
  case VARIABLE_TYPE_BVEC2:
  case VARIABLE_TYPE_BVEC3:
  case VARIABLE_TYPE_BVEC4:
  case VARIABLE_TYPE_DVEC2:
  case VARIABLE_TYPE_DVEC3:
  case VARIABLE_TYPE_DVEC4:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized base variable type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x612);
  }
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Utils::_variable_type Utils::getVariableTypeFromProperties(const _variable_type& base_variable_type,
														   const unsigned int&   n_components)
{
	_variable_type result = VARIABLE_TYPE_UNKNOWN;

	switch (base_variable_type)
	{
	case VARIABLE_TYPE_BOOL:
	{
		switch (n_components)
		{
		case 1:
			result = VARIABLE_TYPE_BOOL;
			break;
		case 2:
			result = VARIABLE_TYPE_BVEC2;
			break;
		case 3:
			result = VARIABLE_TYPE_BVEC3;
			break;
		case 4:
			result = VARIABLE_TYPE_BVEC4;
			break;

		default:
		{
			TCU_FAIL("Unsupported number of components requested");
		}
		} /* switch (n_components) */

		break;
	}

	case VARIABLE_TYPE_DOUBLE:
	{
		switch (n_components)
		{
		case 1:
			result = VARIABLE_TYPE_DOUBLE;
			break;
		case 2:
			result = VARIABLE_TYPE_DVEC2;
			break;
		case 3:
			result = VARIABLE_TYPE_DVEC3;
			break;
		case 4:
			result = VARIABLE_TYPE_DVEC4;
			break;

		default:
		{
			TCU_FAIL("Unsupported number of components requested");
		}
		} /* switch (n_components) */

		break;
	}

	case VARIABLE_TYPE_FLOAT:
	{
		switch (n_components)
		{
		case 1:
			result = VARIABLE_TYPE_FLOAT;
			break;
		case 2:
			result = VARIABLE_TYPE_VEC2;
			break;
		case 3:
			result = VARIABLE_TYPE_VEC3;
			break;
		case 4:
			result = VARIABLE_TYPE_VEC4;
			break;

		default:
		{
			TCU_FAIL("Unsupported number of components requested");
		}
		} /* switch (n_components) */

		break;
	}

	case VARIABLE_TYPE_INT:
	{
		switch (n_components)
		{
		case 1:
			result = VARIABLE_TYPE_INT;
			break;
		case 2:
			result = VARIABLE_TYPE_IVEC2;
			break;
		case 3:
			result = VARIABLE_TYPE_IVEC3;
			break;
		case 4:
			result = VARIABLE_TYPE_IVEC4;
			break;

		default:
		{
			TCU_FAIL("Unsupported number of components requested");
		}
		} /* switch (n_components) */

		break;
	}

	case VARIABLE_TYPE_UINT:
	{
		switch (n_components)
		{
		case 1:
			result = VARIABLE_TYPE_UINT;
			break;
		case 2:
			result = VARIABLE_TYPE_UVEC2;
			break;
		case 3:
			result = VARIABLE_TYPE_UVEC3;
			break;
		case 4:
			result = VARIABLE_TYPE_UVEC4;
			break;

		default:
		{
			TCU_FAIL("Unsupported number of components requested");
		}
		} /* switch (n_components) */

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized base variable type");
	}
	} /* switch (base_variable_type) */

	return result;
}